

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator_tests.cpp
# Opt level: O0

void apply_constant<ear::dsp::LinearInterpSingle,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>,float>
               (VectorBlock<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *in,
               VectorBlock<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *out,float *point)

{
  size_t sVar1;
  float **in_00;
  float **out_00;
  Index range_end;
  undefined1 local_60 [8];
  PtrAdapter out_p;
  undefined1 local_38 [8];
  PtrAdapter in_p;
  float *point_local;
  VectorBlock<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *out_local;
  VectorBlock<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *in_local;
  
  in_p._ptrs.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)point;
  sVar1 = Eigen::MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>::cols
                    ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                      *)in);
  ear::dsp::PtrAdapterT<float_*>::PtrAdapterT((PtrAdapterT<float_*> *)local_38,sVar1);
  ear::dsp::PtrAdapterT<float*>::set_eigen<Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>&>
            ((PtrAdapterT<float*> *)local_38,in,0);
  sVar1 = Eigen::MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>::cols
                    ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                      *)out);
  ear::dsp::PtrAdapterT<float_*>::PtrAdapterT((PtrAdapterT<float_*> *)local_60,sVar1);
  ear::dsp::PtrAdapterT<float*>::set_eigen<Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>&>
            ((PtrAdapterT<float*> *)local_60,out,0);
  in_00 = ear::dsp::PtrAdapterT<float_*>::ptrs((PtrAdapterT<float_*> *)local_38);
  out_00 = ear::dsp::PtrAdapterT<float_*>::ptrs((PtrAdapterT<float_*> *)local_60);
  range_end = Eigen::MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>::
              rows((MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0> *)
                   in);
  ear::dsp::LinearInterpSingle::apply_constant
            (in_00,out_00,0,range_end,
             (Point *)in_p._ptrs.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  ear::dsp::PtrAdapterT<float_*>::~PtrAdapterT((PtrAdapterT<float_*> *)local_60);
  ear::dsp::PtrAdapterT<float_*>::~PtrAdapterT((PtrAdapterT<float_*> *)local_38);
  return;
}

Assistant:

void apply_constant(In &&in, Out &&out, const Point &point) {
  PtrAdapter in_p(in.cols());
  in_p.set_eigen(in);
  PtrAdapter out_p(out.cols());
  out_p.set_eigen(out);

  Interp::apply_constant(in_p.ptrs(), out_p.ptrs(), 0, (SampleIndex)in.rows(),
                         point);
}